

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>,_true>
duckdb::BitpackingInitAnalyze<duckdb::hugeint_t>(ColumnData *col_data,PhysicalType type)

{
  BitpackingMode BVar1;
  DatabaseInstance *db;
  DBConfig *pDVar2;
  BitpackingAnalyzeState<duckdb::hugeint_t> *this;
  pointer pBVar3;
  pointer *__ptr;
  undefined7 in_register_00000031;
  templated_unique_single_t state;
  CompressionInfo info;
  _Head_base<0UL,_duckdb::BitpackingAnalyzeState<duckdb::hugeint_t>_*,_false> local_38;
  CompressionInfo local_30;
  
  db = ColumnData::GetDatabase((ColumnData *)CONCAT71(in_register_00000031,type));
  pDVar2 = DBConfig::GetConfig(db);
  local_30.block_manager = ((ColumnData *)CONCAT71(in_register_00000031,type))->block_manager;
  this = (BitpackingAnalyzeState<duckdb::hugeint_t> *)operator_new(0x108b8);
  BitpackingAnalyzeState<duckdb::hugeint_t>::BitpackingAnalyzeState(this,&local_30);
  BVar1 = (pDVar2->options).force_bitpacking_mode;
  local_38._M_head_impl = this;
  pBVar3 = unique_ptr<duckdb::BitpackingAnalyzeState<duckdb::hugeint_t>,_std::default_delete<duckdb::BitpackingAnalyzeState<duckdb::hugeint_t>_>,_true>
           ::operator->((unique_ptr<duckdb::BitpackingAnalyzeState<duckdb::hugeint_t>,_std::default_delete<duckdb::BitpackingAnalyzeState<duckdb::hugeint_t>_>,_true>
                         *)&local_38);
  (pBVar3->state).mode = BVar1;
  col_data->_vptr_ColumnData = (_func_int **)local_38._M_head_impl;
  return (unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>)
         (unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>)col_data;
}

Assistant:

unique_ptr<AnalyzeState> BitpackingInitAnalyze(ColumnData &col_data, PhysicalType type) {
	auto &config = DBConfig::GetConfig(col_data.GetDatabase());

	CompressionInfo info(col_data.GetBlockManager());
	auto state = make_uniq<BitpackingAnalyzeState<T>>(info);
	state->state.mode = config.options.force_bitpacking_mode;

	return std::move(state);
}